

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O0

uint64_t highwayhash::(anonymous_namespace)::RunHighway<1u>(void *param_1,size_t size)

{
  undefined1 local_4a0 [8];
  HHStateT<1U> state;
  HHResult64 result;
  char in [1024];
  size_t size_local;
  void *param_1_local;
  
  result._0_1_ = (undefined1)size;
  in._1016_8_ = size;
  Portable::HHStatePortable::HHStatePortable
            ((HHStatePortable *)local_4a0,anon_unknown_5::RunHighway<1U>::key);
  HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>
            ((HHStatePortable *)local_4a0,(char *)&result,in._1016_8_,state.mul1 + 3);
  return state.mul1[3];
}

Assistant:

uint64_t RunHighway(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  HHResult64 result;
  HHStateT<Target> state(key);
  HighwayHashT(&state, in, size, &result);
  return result;
}